

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt.cpp
# Opt level: O0

long testCreateNewOrderSingle(int count)

{
  long lVar1;
  long lVar2;
  NewOrderSingle local_3f0;
  undefined1 local_298 [8];
  OrdType ordType;
  TransactTime transactTime;
  Side side;
  STRING local_188;
  undefined1 local_168 [8];
  Symbol symbol;
  undefined1 local_108 [8];
  HandlInst handlInst;
  allocator<char> local_99;
  STRING local_98;
  undefined1 local_78 [8];
  ClOrdID clOrdID;
  int i;
  long start;
  int count_local;
  
  lVar1 = GetTickCount();
  for (clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum = 0;
      clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum <= count;
      clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum =
           clOrdID.super_StringField.super_FieldBase.m_metrics.m_checksum + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"ORDERID",&local_99);
    FIX::ClOrdID::ClOrdID((ClOrdID *)local_78,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    symbol.super_StringField.super_FieldBase.m_metrics.m_checksum._3_1_ = 0x31;
    FIX::HandlInst::HandlInst
              ((HandlInst *)local_108,
               (CHAR *)((long)&symbol.super_StringField.super_FieldBase.m_metrics.m_checksum + 3));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_188,"LNUX",
               (allocator<char> *)
               ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
    FIX::Symbol::Symbol((Symbol *)local_168,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&side.super_CharField.super_FieldBase.m_metrics.m_checksum + 3));
    FIX::Side::Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
                    "11FIX.4.2");
    FIX::TransactTime::now();
    FIX::OrdType::OrdType((OrdType *)local_298,"1FIX.4.2");
    FIX42::NewOrderSingle::NewOrderSingle
              (&local_3f0,(ClOrdID *)local_78,(HandlInst *)local_108,(Symbol *)local_168,
               (Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics,
               (TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics,
               (OrdType *)local_298);
    FIX42::NewOrderSingle::~NewOrderSingle(&local_3f0);
    FIX::OrdType::~OrdType((OrdType *)local_298);
    FIX::TransactTime::~TransactTime
              ((TransactTime *)&ordType.super_CharField.super_FieldBase.m_metrics);
    FIX::Side::~Side((Side *)&transactTime.super_UtcTimeStampField.super_FieldBase.m_metrics);
    FIX::Symbol::~Symbol((Symbol *)local_168);
    FIX::HandlInst::~HandlInst((HandlInst *)local_108);
    FIX::ClOrdID::~ClOrdID((ClOrdID *)local_78);
  }
  lVar2 = GetTickCount();
  return lVar2 - lVar1;
}

Assistant:

long testCreateNewOrderSingle(int count) {
  long start = GetTickCount();
  for (int i = 0; i <= count; ++i) {
    FIX::ClOrdID clOrdID("ORDERID");
    FIX::HandlInst handlInst('1');
    FIX::Symbol symbol("LNUX");
    FIX::Side side(FIX::Side_BUY);
    FIX::TransactTime transactTime = FIX::TransactTime::now();
    FIX::OrdType ordType(FIX::OrdType_MARKET);
    FIX42::NewOrderSingle(clOrdID, handlInst, symbol, side, transactTime, ordType);
  }

  return GetTickCount() - start;
}